

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,char *pCmd_line,uint n,param_desc *pParam_desc,
          bool skip_first_param)

{
  bool bVar1;
  byte in_R8B;
  dynamic_string_array p;
  param_desc *in_stack_000002a0;
  uint in_stack_000002ac;
  dynamic_string_array *in_stack_000002b0;
  command_line_params *in_stack_000002b8;
  uint in_stack_ffffffffffffff8c;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  dynamic_string *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  bool local_1;
  
  vector<crnlib::dynamic_string>::vector((vector<crnlib::dynamic_string> *)&stack0xffffffffffffffc0)
  ;
  bVar1 = split_params(in_stack_ffffffffffffffc8,(dynamic_string_array *)in_stack_ffffffffffffffc0);
  if (bVar1) {
    in_stack_ffffffffffffff97 =
         vector<crnlib::dynamic_string>::empty
                   ((vector<crnlib::dynamic_string> *)&stack0xffffffffffffffc0);
    if ((bool)in_stack_ffffffffffffff97) {
      local_1 = false;
    }
    else {
      if ((in_R8B & 1) != 0) {
        vector<crnlib::dynamic_string>::erase
                  ((vector<crnlib::dynamic_string> *)
                   CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   in_stack_ffffffffffffff8c);
      }
      in_stack_ffffffffffffff96 =
           parse(in_stack_000002b8,in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
      local_1 = (bool)in_stack_ffffffffffffff96;
    }
  }
  else {
    local_1 = false;
  }
  vector<crnlib::dynamic_string>::~vector
            ((vector<crnlib::dynamic_string> *)
             CONCAT17(in_stack_ffffffffffffff97,
                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  return local_1;
}

Assistant:

bool command_line_params::parse(const char* pCmd_line, uint n, const param_desc* pParam_desc, bool skip_first_param) {
  CRNLIB_ASSERT(n && pParam_desc);

  dynamic_string_array p;
  if (!split_params(pCmd_line, p))
    return 0;

  if (p.empty())
    return 0;

  if (skip_first_param)
    p.erase(0U);

  return parse(p, n, pParam_desc);
}